

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall
MessageParse_SinglePartCommand_Test::MessageParse_SinglePartCommand_Test
          (MessageParse_SinglePartCommand_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018acd0;
  return;
}

Assistant:

TEST (MessageParse, SinglePartCommand) {
    using namespace pstore::broker;
    pstore::broker::partial_cmds cmds;
    std::unique_ptr<broker_command> command =
        parse (pstore::brokerface::message_type (1234, 0, 1, "HELO hello world"s), cmds);
    ASSERT_NE (command.get (), nullptr);
    EXPECT_EQ (command->verb, "HELO");
    EXPECT_EQ (command->path, "hello world");
    EXPECT_EQ (cmds.size (), 0U);
}